

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

void Curl_cshutdn_setfds(cshutdn *cshutdn,Curl_easy *data,fd_set *read_fd_set,fd_set *write_fd_set,
                        int *maxfd)

{
  Curl_llist_node *pCVar1;
  connectdata *conn_00;
  connectdata *conn;
  undefined1 local_58 [4];
  uint i;
  easy_pollset ps;
  Curl_llist_node *e;
  int *maxfd_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  Curl_easy *data_local;
  cshutdn *cshutdn_local;
  
  pCVar1 = Curl_llist_head(&cshutdn->list);
  if (pCVar1 != (Curl_llist_node *)0x0) {
    for (ps._24_8_ = Curl_llist_head(&cshutdn->list); ps._24_8_ != 0;
        ps._24_8_ = Curl_node_next((Curl_llist_node *)ps._24_8_)) {
      conn_00 = (connectdata *)Curl_node_elem((Curl_llist_node *)ps._24_8_);
      memset(local_58,0,0x20);
      Curl_attach_connection(data,conn_00);
      Curl_conn_adjust_pollset(data,conn_00,(easy_pollset *)local_58);
      Curl_detach_connection(data);
      for (conn._4_4_ = 0; conn._4_4_ < (uint)ps.sockets[3]; conn._4_4_ = conn._4_4_ + 1) {
        if ((*(byte *)((long)ps.sockets + (ulong)conn._4_4_ + 0x10) & 1) != 0) {
          read_fd_set->fds_bits[*(int *)(local_58 + (ulong)conn._4_4_ * 4) / 0x40] =
               1L << ((byte)((long)*(int *)(local_58 + (ulong)conn._4_4_ * 4) % 0x40) & 0x3f) |
               read_fd_set->fds_bits[*(int *)(local_58 + (ulong)conn._4_4_ * 4) / 0x40];
        }
        if ((*(byte *)((long)ps.sockets + (ulong)conn._4_4_ + 0x10) & 2) != 0) {
          write_fd_set->fds_bits[*(int *)(local_58 + (ulong)conn._4_4_ * 4) / 0x40] =
               1L << ((byte)((long)*(int *)(local_58 + (ulong)conn._4_4_ * 4) % 0x40) & 0x3f) |
               write_fd_set->fds_bits[*(int *)(local_58 + (ulong)conn._4_4_ * 4) / 0x40];
        }
        if (((*(byte *)((long)ps.sockets + (ulong)conn._4_4_ + 0x10) & 3) != 0) &&
           (*maxfd < *(int *)(local_58 + (ulong)conn._4_4_ * 4))) {
          *maxfd = *(int *)(local_58 + (ulong)conn._4_4_ * 4);
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_cshutdn_setfds(struct cshutdn *cshutdn,
                         struct Curl_easy *data,
                         fd_set *read_fd_set, fd_set *write_fd_set,
                         int *maxfd)
{
  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      struct easy_pollset ps;
      unsigned int i;
      struct connectdata *conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      for(i = 0; i < ps.num; i++) {
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
        if(ps.actions[i] & CURL_POLL_IN)
          FD_SET(ps.sockets[i], read_fd_set);
        if(ps.actions[i] & CURL_POLL_OUT)
          FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
        if((ps.actions[i] & (CURL_POLL_OUT | CURL_POLL_IN)) &&
           ((int)ps.sockets[i] > *maxfd))
          *maxfd = (int)ps.sockets[i];
      }
    }
  }
}